

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

int __thiscall google::protobuf::EnumValueOptions::ByteSize(EnumValueOptions *this)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  int iVar2;
  Type *value;
  int i;
  int index;
  int iVar3;
  
  iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  iVar3 = iVar2 * 2;
  for (index = 0; index < iVar2; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::UninterpretedOption>
                      (value);
    iVar3 = iVar3 + iVar2;
    iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  }
  iVar2 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar2 = iVar2 + iVar3;
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar3 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar2 = iVar2 + iVar3;
  }
  this->_cached_size_ = iVar2;
  return iVar2;
}

Assistant:

int EnumValueOptions::ByteSize() const {
  int total_size = 0;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2 * this->uninterpreted_option_size();
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->uninterpreted_option(i));
  }

  total_size += _extensions_.ByteSize();

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}